

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O2

bool ImGui::SelectPath(char *popupId,string *path)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  string *s;
  pointer pbVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_),
     iVar3 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_,"<uninit>",
               (allocator<char> *)&local_48);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_);
  }
  if ((SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_),
     iVar3 != 0)) {
    SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,&SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_);
  }
  bVar5 = false;
  bVar2 = BeginPopup(popupId,0);
  if (bVar2) {
    if (path->_M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)path);
    }
    else {
      LTRemoveXPSystemPath(path);
    }
    if ((1 < path->_M_string_length) &&
       ((path->_M_dataplus)._M_p[path->_M_string_length - 1] == '/')) {
      std::__cxx11::string::pop_back();
    }
    bVar2 = std::operator!=(&SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_,path);
    if (bVar2) {
      std::__cxx11::string::_M_assign
                ((string *)&SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_);
      GetDirContents(&local_48,path,true);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_,&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
    bVar2 = std::operator!=(path,"/");
    if (bVar2) {
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bVar5 = false;
      bVar2 = Selectable(anon_var_dwarf_1c8037,false,0,(ImVec2 *)&local_48);
      pbVar6 = SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar2) {
        lVar4 = std::__cxx11::string::find_last_of((char *)path,0x2575af);
        if (lVar4 == -1) {
          path->_M_string_length = 0;
          *(path->_M_dataplus)._M_p = '\0';
        }
        else {
          std::__cxx11::string::erase((ulong)path,lVar4 + (ulong)(lVar4 == 0));
        }
        bVar5 = true;
        pbVar6 = SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else {
      bVar5 = false;
      pbVar6 = SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bVar2 = Selectable((pbVar6->_M_dataplus)._M_p,false,0,(ImVec2 *)&local_48);
      if (bVar2) {
        bVar2 = std::operator!=(path,"/");
        if (bVar2) {
          std::__cxx11::string::push_back((char)path);
        }
        std::__cxx11::string::append((string *)path);
        bVar5 = true;
      }
    }
    EndPopup();
  }
  return bVar5;
}

Assistant:

IMGUI_API bool SelectPath (const char* popupId, std::string& path)
{
    static std::string _p ("<uninit>");
    static std::vector<std::string> _l;

    bool ret = false;
    if (BeginPopup(popupId))
    {
        // Replace an empty path with X-Plane's root
        if (path.empty())
            path = dataRefs.GetXPSystemPath();
        // If a path starts with system path, strip the system path
        else {
#if IBM
            // Replace any backslashes with forward slashes as XP seems to do that internally, too
            for (char& c : path)
                if (c == '\\') c = '/';
            // except for the one after the drive letter
            if (path.length() >= 2 && path[1] == ':') {
                // Windows drive letter -> upper case
                path[0] = (char)toupper(path[0]);
                // that slash afterwards needs to be a backslash
                if (path.length() >= 3 && path[2] == '/')
                    path[2] = '\\';
            }
#endif
            LTRemoveXPSystemPath(path);
        }
        
        // make sure path doesn't end on slash
        // (but keep a single slash for "root"...and as the one after a Windows drive letter is kept as backslash it won't be removed either
        if (path.size() > 1 && path.back() == '/')
            path.pop_back();
        
        // make sure we have the proper list of subdirectories
        if (_p != path) {
            _p = path;
            _l = GetDirContents(path,true);
        }
        
        // Can we offer a "dir up" entry?
#if IBM
        if (path.size() > 3 && path[1] == ':')
#else
        if (path != "/")
#endif
        {
            if (Selectable(ICON_FA_LEVEL_UP_ALT)) {
                size_t lastSlash = path.find_last_of(PATH_DELIMS);
                if (lastSlash != std::string::npos)
                    path.erase(std::max(lastSlash, size_t(1)));// one level up, but keep a single slash for root
                else
                    path.clear();                   // nothing left
                ret = true;                         // something selected
            }
        }
        
        // Subdirs of that path, as a Listbox
        for (const std::string& s: _l) {
            if (Selectable(s.c_str())) {
                if (path != "/")
                    path += '/';                // always use forward slash, also on Windows
                path += s;                      // one level down
                ret = true;                     // something selected
            }
        }
        
        EndPopup();
    }
    
    return ret;
}